

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createSubdivSphere
          (Vec3fa *center,float radius,size_t N,float tessellationRate,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 uVar1;
  BBox1f time_range;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  reference pvVar6;
  unsigned_long *puVar7;
  Vec3fa *pVVar8;
  long *in_RCX;
  uint in_EDX;
  float *in_RSI;
  Node *in_RDI;
  float in_XMM0_Da;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float __x;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined4 in_XMM1_Da;
  uint p11_1;
  uint p10_2;
  uint p01_1;
  uint p00_2;
  uint theta_3;
  uint p10_1;
  uint p01;
  uint p00_1;
  uint theta_2;
  uint p11;
  uint p10;
  uint p00;
  uint theta_1;
  float thetaf;
  float phif;
  uint theta;
  uint phi;
  float rcpNumPhi;
  float rcpNumTheta;
  Ref<embree::SceneGraph::SubdivMeshNode> mesh;
  uint numVertices;
  uint numTheta;
  uint numPhi;
  __m128 r_1;
  __m128 a_1;
  __m128 r;
  __m128 a;
  size_t i_3;
  size_t i_2;
  Vec3fa *old_items;
  size_t i_1;
  size_t i;
  size_t new_size_alloced;
  value_type_conflict2 *in_stack_fffffffffffff988;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff990;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff998;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff9a0;
  size_t in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  SubdivMeshNode *in_stack_fffffffffffffa68;
  float in_stack_fffffffffffffa70;
  float in_stack_fffffffffffffa74;
  uint local_4b4;
  uint local_4a0;
  uint local_48c;
  uint local_480;
  uint local_47c;
  undefined4 local_46c;
  undefined4 local_468;
  undefined4 local_464;
  undefined4 uStack_460;
  long *local_450;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_448;
  uint local_43c;
  uint local_438;
  uint local_434;
  undefined4 local_424;
  float local_414;
  float *local_410;
  long **local_3f8;
  undefined4 *local_3f0;
  undefined4 *local_3e8;
  undefined4 *local_3e0;
  long **local_3d8;
  ulong local_3c8;
  reference local_3c0;
  ulong local_3b8;
  reference local_3b0;
  ulong local_3a8;
  reference local_3a0;
  ulong local_398;
  reference local_390;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_388;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_380;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_378;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_370;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_368;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_360;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_358;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_350;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_348;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_340;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_338;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_330;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_328;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_320;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_318;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_310;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_308;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_300;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_2f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_2f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_2e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_2d8;
  undefined1 local_2c8 [16];
  ulong local_2b8;
  undefined8 uStack_2b0;
  float local_29c;
  undefined1 local_298 [16];
  ulong local_288;
  undefined8 uStack_280;
  float local_274;
  undefined1 *local_270;
  undefined1 *local_268;
  float local_25c;
  float local_258;
  float local_254;
  float local_250;
  float local_24c;
  undefined1 local_248 [16];
  undefined4 local_22c;
  undefined1 local_228 [16];
  float local_20c;
  undefined1 local_208 [16];
  undefined4 local_1ec;
  undefined1 local_1e8 [16];
  float local_1cc;
  ulong local_1c8;
  undefined8 uStack_1c0;
  ulong local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  ulong local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  ulong local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  ulong local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  ulong local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  ulong local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ulong local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  ulong local_c0;
  Vec3fa *local_b8;
  ulong local_b0;
  ulong local_a8;
  size_t local_a0;
  ulong local_98;
  reference local_90;
  Vec3fa *local_88;
  Vec3fa *local_80;
  Vec3fa *local_78;
  Vec3fa *local_70;
  size_t local_68;
  Vec3fa *local_60;
  reference local_58;
  size_t local_50;
  reference local_48;
  unsigned_long local_40 [2];
  ulong local_30;
  ulong local_28;
  reference local_20;
  size_t local_18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_10;
  
  local_438 = in_EDX * 2;
  local_43c = local_438 * (in_EDX + 1);
  local_434 = in_EDX;
  local_424 = in_XMM1_Da;
  local_414 = in_XMM0_Da;
  local_410 = in_RSI;
  pvVar5 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)::operator_new(0x1b0);
  local_3f8 = &local_450;
  local_450 = (long *)*in_RCX;
  if (local_450 != (long *)0x0) {
    (**(code **)(*local_450 + 0x10))();
  }
  local_468 = 0;
  local_46c = 0x3f800000;
  local_3e0 = &local_464;
  local_3e8 = &local_468;
  local_3f0 = &local_46c;
  local_464 = 0;
  uStack_460 = 0x3f800000;
  time_range.upper = in_stack_fffffffffffffa74;
  time_range.lower = in_stack_fffffffffffffa70;
  SubdivMeshNode::SubdivMeshNode
            (in_stack_fffffffffffffa68,
             (Ref<embree::SceneGraph::MaterialNode> *)
             CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),time_range,
             in_stack_fffffffffffffa58);
  local_380 = &local_448;
  local_388 = pvVar5;
  local_448 = pvVar5;
  if (pvVar5 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    (**(code **)((long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start + 0x10))();
  }
  local_3d8 = &local_450;
  if (local_450 != (long *)0x0) {
    (**(code **)(*local_450 + 0x18))();
  }
  local_2f0 = &local_448;
  *(undefined4 *)
   &local_448[0x11].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_424;
  local_2f8 = &local_448;
  pvVar6 = std::
           vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         *)&local_448[4].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0);
  local_98 = (ulong)local_43c;
  local_3c8 = local_98;
  local_3c0 = pvVar6;
  local_28 = local_98;
  local_20 = pvVar6;
  if (pvVar6->size_alloced < local_98) {
    local_18 = local_98;
    if (pvVar6->size_alloced != 0) {
      local_30 = pvVar6->size_alloced;
      while (local_30 < local_28) {
        local_40[1] = 1;
        local_40[0] = local_30 << 1;
        puVar7 = std::max<unsigned_long>(local_40 + 1,local_40);
        local_30 = *puVar7;
      }
      local_18 = local_30;
    }
  }
  else {
    local_18 = pvVar6->size_alloced;
  }
  local_a0 = local_18;
  uVar4 = local_98;
  if (local_98 < pvVar6->size_active) {
    while (local_a8 = uVar4, local_a8 < pvVar6->size_active) {
      uVar4 = local_a8 + 1;
    }
    pvVar6->size_active = local_98;
  }
  local_90 = pvVar6;
  if (local_18 == pvVar6->size_alloced) {
    for (local_b0 = pvVar6->size_active; local_b0 < local_98; local_b0 = local_b0 + 1) {
      local_88 = pvVar6->items + local_b0;
    }
    pvVar6->size_active = local_98;
  }
  else {
    local_b8 = pvVar6->items;
    local_50 = local_18;
    local_48 = pvVar6;
    pVVar8 = (Vec3fa *)
             alignedMalloc((size_t)in_stack_fffffffffffff998,(size_t)in_stack_fffffffffffff990);
    pvVar6->items = pVVar8;
    for (local_c0 = 0; local_c0 < pvVar6->size_active; local_c0 = local_c0 + 1) {
      local_70 = pvVar6->items + local_c0;
      local_78 = local_b8 + local_c0;
      uVar1 = *(undefined8 *)((long)&local_78->field_0 + 8);
      *(undefined8 *)&local_70->field_0 = *(undefined8 *)&local_78->field_0;
      *(undefined8 *)((long)&local_70->field_0 + 8) = uVar1;
    }
    for (local_c8 = pvVar6->size_active; local_c8 < local_98; local_c8 = local_c8 + 1) {
      local_80 = pvVar6->items + local_c8;
    }
    local_68 = pvVar6->size_alloced;
    local_60 = local_b8;
    local_58 = pvVar6;
    alignedFree(in_stack_fffffffffffff988);
    pvVar6->size_active = local_98;
    pvVar6->size_alloced = local_a0;
  }
  local_274 = (float)local_438;
  local_228._4_4_ = 0;
  local_228._0_4_ = local_274;
  local_288 = local_228._0_8_;
  uStack_280 = 0;
  local_1c8 = local_228._0_8_;
  uStack_1c0 = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_228._0_8_;
  local_298 = rcpss(auVar2,auVar2);
  local_22c = 0x40000000;
  local_248 = ZEXT416(0x40000000);
  local_168 = local_228._0_8_;
  uStack_160 = 0;
  local_158._0_4_ = local_298._0_4_;
  fVar10 = (float)local_158;
  local_158._4_4_ = local_298._4_4_;
  local_158._0_4_ = (float)local_158 * local_274;
  uStack_150 = local_298._8_8_;
  local_108 = local_158;
  uStack_100 = local_298._8_8_;
  fVar9 = 2.0 - (float)local_158;
  local_f8 = (ulong)(uint)fVar9;
  uStack_f0 = 0;
  local_188 = local_f8;
  uStack_180 = 0;
  fVar10 = fVar10 * fVar9;
  local_178 = CONCAT44(local_158._4_4_,fVar10);
  uStack_170 = local_298._8_8_;
  local_1a8 = local_178;
  uStack_1a0 = local_298._8_8_;
  local_29c = (float)local_434;
  local_1e8._4_4_ = 0;
  local_1e8._0_4_ = local_29c;
  local_2b8 = local_1e8._0_8_;
  uStack_2b0 = 0;
  local_1b8 = local_1e8._0_8_;
  uStack_1b0 = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_1e8._0_8_;
  local_2c8 = rcpss(auVar3,auVar3);
  local_1ec = 0x40000000;
  local_208 = ZEXT416(0x40000000);
  local_128 = local_1e8._0_8_;
  uStack_120 = 0;
  local_118._0_4_ = local_2c8._0_4_;
  fVar9 = (float)local_118;
  local_118._4_4_ = local_2c8._4_4_;
  local_118._0_4_ = (float)local_118 * local_29c;
  uStack_110 = local_2c8._8_8_;
  local_e8 = local_118;
  uStack_e0 = local_2c8._8_8_;
  fVar11 = 2.0 - (float)local_118;
  local_d8 = (ulong)(uint)fVar11;
  uStack_d0 = 0;
  local_148 = local_d8;
  uStack_140 = 0;
  fVar9 = fVar9 * fVar11;
  local_138 = CONCAT44(local_118._4_4_,fVar9);
  uStack_130 = local_2c8._8_8_;
  local_198 = local_138;
  uStack_190 = local_2c8._8_8_;
  local_228 = ZEXT416((uint)local_274);
  local_20c = local_274;
  local_1e8 = ZEXT416((uint)local_29c);
  local_1cc = local_29c;
  for (local_47c = 0; local_47c <= local_434; local_47c = local_47c + 1) {
    for (local_480 = 0; fVar11 = local_414, local_480 < local_438; local_480 = local_480 + 1) {
      local_268 = &pi;
      fVar12 = (float)local_47c * 3.1415927 * fVar9;
      local_270 = &pi;
      __x = (float)local_480 * 2.0 * 3.1415927 * fVar10;
      fVar15 = *local_410;
      local_254 = fVar12;
      fVar13 = sinf(fVar12);
      local_258 = __x;
      fVar14 = sinf(__x);
      local_300 = &local_448;
      local_390 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)&local_448[4].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      fVar16 = local_414;
      local_398 = (ulong)(local_47c * local_438 + local_480);
      local_390->items[local_398].field_0.m128[0] = fVar11 * fVar13 * fVar14 + fVar15;
      fVar11 = local_410[1];
      local_24c = fVar12;
      fVar15 = cosf(fVar12);
      fVar11 = fVar16 * fVar15 + fVar11;
      local_308 = &local_448;
      local_3a0 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)&local_448[4].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      fVar15 = local_414;
      local_3a8 = (ulong)(local_47c * local_438 + local_480);
      local_3a0->items[local_3a8].field_0.m128[1] = fVar11;
      fVar11 = local_410[2];
      local_25c = fVar12;
      fVar16 = sinf(fVar12);
      local_250 = __x;
      fVar12 = cosf(__x);
      local_310 = &local_448;
      local_3b0 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)&local_448[4].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      local_3b8 = (ulong)(local_47c * local_438 + local_480);
      local_3b0->items[local_3b8].field_0.m128[2] = fVar15 * fVar16 * fVar12 + fVar11;
    }
    if (local_47c != 0) {
      if (local_47c == 1) {
        for (local_48c = 1; local_48c <= local_438; local_48c = local_48c + 1) {
          local_318 = &local_448;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
          local_320 = &local_448;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (in_stack_fffffffffffff9a0,(value_type_conflict2 *)in_stack_fffffffffffff998);
          local_328 = &local_448;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (in_stack_fffffffffffff9a0,(value_type_conflict2 *)in_stack_fffffffffffff998);
          local_330 = &local_448;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (in_stack_fffffffffffff9a0,(value_type_conflict2 *)in_stack_fffffffffffff998);
        }
      }
      else if (local_47c == local_434) {
        for (local_4a0 = 1; local_4a0 <= local_438; local_4a0 = local_4a0 + 1) {
          local_338 = &local_448;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
          local_340 = &local_448;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (in_stack_fffffffffffff9a0,(value_type_conflict2 *)in_stack_fffffffffffff998);
          local_348 = &local_448;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (in_stack_fffffffffffff9a0,(value_type_conflict2 *)in_stack_fffffffffffff998);
          local_350 = &local_448;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (in_stack_fffffffffffff9a0,(value_type_conflict2 *)in_stack_fffffffffffff998);
        }
      }
      else {
        for (local_4b4 = 1; local_4b4 <= local_438; local_4b4 = local_4b4 + 1) {
          local_358 = &local_448;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
          local_360 = &local_448;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (in_stack_fffffffffffff9a0,(value_type_conflict2 *)in_stack_fffffffffffff998);
          local_368 = &local_448;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (in_stack_fffffffffffff9a0,(value_type_conflict2 *)in_stack_fffffffffffff998);
          local_370 = &local_448;
          in_stack_fffffffffffff9a0 = local_448;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (local_448,(value_type_conflict2 *)in_stack_fffffffffffff998);
          local_378 = &local_448;
          in_stack_fffffffffffff998 = local_448;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (in_stack_fffffffffffff9a0,(value_type_conflict2 *)local_448);
        }
      }
    }
  }
  local_2e8 = &local_448;
  local_10 = local_448;
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)local_448;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_2d8 = &local_448;
  if (local_448 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    (**(code **)((long)(local_448->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createSubdivSphere (const Vec3fa& center, const float radius, size_t N, float tessellationRate, Ref<MaterialNode> material)
  {
    unsigned numPhi = unsigned(N);
    unsigned numTheta = 2*numPhi;
    unsigned numVertices = numTheta*(numPhi+1);
    Ref<SceneGraph::SubdivMeshNode> mesh = new SceneGraph::SubdivMeshNode(material,BBox1f(0,1),1);
    mesh->tessellationRate = tessellationRate;
    mesh->positions[0].resize(numVertices);

    /* create sphere geometry */
    const float rcpNumTheta = rcp((float)numTheta);
    const float rcpNumPhi   = rcp((float)numPhi);
    for (unsigned int phi=0; phi<=numPhi; phi++)
    {
      for (unsigned int theta=0; theta<numTheta; theta++)
      {
	const float phif   = phi*float(pi)*rcpNumPhi;
	const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;
	mesh->positions[0][phi*numTheta+theta].x = center.x + radius*sin(phif)*sin(thetaf);
        mesh->positions[0][phi*numTheta+theta].y = center.y + radius*cos(phif);
	mesh->positions[0][phi*numTheta+theta].z = center.z + radius*sin(phif)*cos(thetaf);
      }
      if (phi == 0) continue;
      
      if (phi == 1)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = numTheta-1;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->verticesPerFace.push_back(3);
          mesh->position_indices.push_back(p10);
          mesh->position_indices.push_back(p00);
          mesh->position_indices.push_back(p11);
	}
      }
      else if (phi == numPhi)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = numPhi*numTheta;
          mesh->verticesPerFace.push_back(3);
          mesh->position_indices.push_back(p10);
          mesh->position_indices.push_back(p00);
          mesh->position_indices.push_back(p01);
	}
      }
      else
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->verticesPerFace.push_back(4);
          mesh->position_indices.push_back(p10);
          mesh->position_indices.push_back(p00);
          mesh->position_indices.push_back(p01);
          mesh->position_indices.push_back(p11);
	}
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }